

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::GetLinkerLauncher
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *config)

{
  cmGeneratorTarget *this_00;
  cmValue cVar1;
  string *i;
  pointer this_01;
  string_view source;
  string_view str;
  string_view separator;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string lang;
  
  cmGeneratorTarget::GetLinkerLanguage(&lang,this->GeneratorTarget,config);
  this_00 = this->GeneratorTarget;
  std::operator+(&local_68,&lang,"_LINKER_LAUNCHER");
  cVar1 = cmGeneratorTarget::GetProperty(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if ((cVar1.Value != (string *)0x0) && ((cVar1.Value)->_M_string_length != 0)) {
    arg._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar1.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&args,arg,true);
    if (args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      source._M_str =
           ((args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      source._M_len =
           (args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_68,
                 &(this->LocalCommonGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                 source,SHELL);
      std::__cxx11::string::operator=
                ((string *)
                 args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      while (this_01 = args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
            this_01 !=
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        str._M_str = (this_01->_M_dataplus)._M_p;
        str._M_len = args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_68,
                   &(this->LocalCommonGenerator->super_cmLocalGenerator).super_cmOutputConverter,str
                   ,false,false,false,false,false);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = this_01;
      }
      separator._M_str = " ";
      separator._M_len = 1;
      cmJoin(__return_storage_ptr__,&args,separator,(string_view)ZEXT816(0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      goto LAB_00321e36;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00321e36:
  std::__cxx11::string::~string((string *)&lang);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetLinkerLauncher(
  const std::string& config)
{
  std::string lang = this->GeneratorTarget->GetLinkerLanguage(config);
  cmValue launcherProp =
    this->GeneratorTarget->GetProperty(lang + "_LINKER_LAUNCHER");
  if (cmNonempty(launcherProp)) {
    // Convert ;-delimited list to single string
    std::vector<std::string> args = cmExpandedList(*launcherProp, true);
    if (!args.empty()) {
      args[0] = this->LocalCommonGenerator->ConvertToOutputFormat(
        args[0], cmOutputConverter::SHELL);
      for (std::string& i : cmMakeRange(args.begin() + 1, args.end())) {
        i = this->LocalCommonGenerator->EscapeForShell(i);
      }
      return cmJoin(args, " ");
    }
  }
  return std::string();
}